

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O2

void zusolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  doublecomplex xj;
  doublecomplex local_48;
  
  lVar10 = (long)ncol;
  iVar11 = 0;
  iVar6 = 0;
  if (0 < ncol) {
    iVar6 = ncol;
  }
  pdVar9 = &M[(lVar10 + -1) * (long)ldm].i;
  for (; iVar11 != iVar6; iVar11 = iVar11 + 1) {
    lVar10 = lVar10 + -1;
    z_div(&local_48,rhs + lVar10,M + lVar10 + (int)lVar10 * ldm);
    rhs[lVar10].r = local_48.r;
    rhs[lVar10].i = local_48.i;
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < lVar10; lVar8 = lVar8 + 1) {
      dVar3 = *(double *)((long)pdVar9 + lVar7 + -8);
      dVar4 = *(double *)((long)pdVar9 + lVar7);
      pdVar1 = (double *)((long)&rhs->r + lVar7);
      dVar5 = pdVar1[1];
      pdVar2 = (double *)((long)&rhs->r + lVar7);
      *pdVar2 = *pdVar1 - (dVar3 * local_48.r + dVar4 * -local_48.i);
      pdVar2[1] = dVar5 - (dVar3 * local_48.i + dVar4 * local_48.r);
      lVar7 = lVar7 + 0x10;
    }
    pdVar9 = pdVar9 + (long)ldm * -2;
  }
  return;
}

Assistant:

void zusolve (int ldm, int ncol, doublecomplex *M, doublecomplex *rhs)
{
    doublecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	z_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    zz_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    z_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}